

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

Trivia __thiscall
slang::parsing::Preprocessor::handleEndIfDirective(Preprocessor *this,Token directive)

{
  size_type sVar1;
  bool taken;
  SourceRange range;
  Trivia TVar2;
  Token directive_00;
  Token local_20;
  
  local_20.info = directive.info;
  local_20._0_8_ = directive._0_8_;
  sVar1 = (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.len;
  if (sVar1 == 0) {
    range = Token::range(&local_20);
    Diagnostics::add(this->diagnostics,(DiagCode)0x190004,range);
  }
  else {
    (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.len =
         sVar1 - 1;
    if (sVar1 - 1 != 0) {
      taken = (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.
              data_[sVar1 - 2].currentActive;
      goto LAB_001fd01f;
    }
  }
  taken = true;
LAB_001fd01f:
  directive_00.info = local_20.info;
  directive_00.kind = local_20.kind;
  directive_00._2_1_ = local_20._2_1_;
  directive_00.numFlags.raw = local_20.numFlags.raw;
  directive_00.rawLen = local_20.rawLen;
  TVar2 = parseBranchDirective(this,directive_00,(ConditionalDirectiveExpressionSyntax *)0x0,taken);
  TVar2._8_8_ = TVar2._8_8_ & 0xffffffffffff;
  return TVar2;
}

Assistant:

Trivia Preprocessor::handleEndIfDirective(Token directive) {
    // pop the active branch off the stack
    bool taken = true;
    if (branchStack.empty())
        addDiag(diag::UnexpectedConditionalDirective, directive.range());
    else {
        branchStack.pop_back();
        if (!branchStack.empty() && !branchStack.back().currentActive)
            taken = false;
    }
    return parseBranchDirective(directive, nullptr, taken);
}